

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall Parser::parseAddExpr(Parser *this)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer *__ptr;
  TokenType tok;
  Parser *in_RSI;
  _Alloc_hider local_30;
  
  parseMulExpr(this);
  tok = (in_RSI->m_currToken).type;
  if ((tok & ~LeftBrace) == Plus) {
    do {
      eatToken(in_RSI,tok);
      parseMulExpr((Parser *)&stack0xffffffffffffffd0);
      pcVar2 = (pointer)operator_new(0x20);
      pcVar1 = (this->m_lexer).m_input._M_dataplus._M_p;
      *(undefined ***)pcVar2 = &PTR__BinaryExpr_00116b20;
      *(TokenType *)(pcVar2 + 8) = tok;
      *(pointer *)(pcVar2 + 0x10) = pcVar1;
      *(pointer *)(pcVar2 + 0x18) = local_30._M_p;
      (this->m_lexer).m_input._M_dataplus._M_p = pcVar2;
      tok = (in_RSI->m_currToken).type;
    } while ((tok & ~LeftBrace) == Plus);
  }
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseAddExpr() {
    std::unique_ptr<AST::Expr> expr = parseMulExpr();
    while (m_currToken.type == TokenType::Plus || m_currToken.type == TokenType::Minus) {
        TokenType op = m_currToken.type;
        eatToken(m_currToken.type);
        std::unique_ptr<AST::Expr> right = parseMulExpr();
        expr = std::make_unique<AST::BinaryExpr>(op,
                                                 std::move(expr),
                                                 std::move(right));
    }
    return expr;
}